

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# motion_search_facade.c
# Opt level: O0

void av1_single_motion_search
               (AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,int ref_idx,int *rate_mv,
               int search_range,inter_mode_info *mode_info,int_mv *best_mv,HandleInterModeArgs *args
               )

{
  bool bVar1;
  int16_t iVar2;
  int iVar3;
  FULLPEL_MV FVar4;
  MV MVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  FULLPEL_MV in_ECX;
  long lVar9;
  undefined8 *puVar10;
  search_site in_RSI;
  search_site in_RDI;
  search_site in_R8;
  FULLPEL_MV in_R9D;
  bool bVar11;
  long in_stack_00000008;
  FULLPEL_MV *in_stack_00000010;
  long in_stack_00000018;
  int this_rate_cost_1;
  int prev_rate_cost_1;
  int prev_ref_idx_1;
  int ref_mv_idx_1;
  int64_t tmp_rd;
  int tmp_mv_rate;
  RD_STATS tmp_rd_stats;
  int this_var;
  uint sse;
  MV this_best_mv_1;
  int this_mv_rate_1;
  RD_STATS this_rd_stats;
  int64_t rd;
  BUFFER_SET orig_dst;
  macroblockd_plane *p;
  int best_mv_var;
  int try_second;
  MV subpel_start_mv;
  SUBPEL_MOTION_SEARCH_PARAMS ms_params;
  int dis;
  int_mv fractional_ms_list [3];
  int mv_rate_calculated;
  int best_mv_rate;
  int use_fractional_mv;
  int thr;
  int psme;
  int this_rate_cost;
  int prev_rate_cost;
  int prev_ref_idx;
  int this_mv_rate;
  int ref_mv_idx;
  int_mv this_mv;
  int i_1;
  int thissme;
  FULLPEL_MV_STATS this_mv_stats;
  FULLPEL_MV this_second_best_mv;
  FULLPEL_MV this_best_mv;
  int_mv smv;
  int m;
  int sum_weight;
  FULLPEL_MOTION_SEARCH_PARAMS full_ms_params;
  int fine_search_interval;
  int_mv second_best_mv;
  FULLPEL_MV_STATS best_mv_stats;
  int cost_list [5];
  search_site_config *search_site_cfg;
  search_site_config *src_search_site_cfg;
  SEARCH_METHODS search_method;
  MV_SPEED_FEATURES *mv_sf;
  int col_diff;
  int row_diff;
  int this_newmv_valid;
  FULLPEL_MV *fmv_stack;
  uint8_t this_ref_mv_idx;
  int stack_idx;
  int skip_cand_mv;
  int_mv *fmv_cand;
  int cand_idx;
  int stack_size;
  int cand_cnt;
  int total_weight;
  int cnt;
  cand_mv_t cand [65];
  FULLPEL_MV start_mv;
  MV ref_mv;
  int step_param;
  int i;
  MvCosts *mv_costs;
  int mi_col;
  int mi_row;
  YV12_BUFFER_CONFIG *scaled_ref_frame;
  int ref;
  int bestsme;
  buf_2d backup_yv12 [3];
  MB_MODE_INFO *mbmi;
  int num_planes;
  MotionVectorSearchParams *mv_search_params;
  AV1_COMMON *cm;
  MACROBLOCKD *xd;
  search_site in_stack_fffffffffffff968;
  int_mv *in_stack_fffffffffffff970;
  int_mv *in_stack_fffffffffffff978;
  FULLPEL_MV in_stack_fffffffffffff980;
  uint in_stack_fffffffffffff984;
  undefined4 in_stack_fffffffffffff988;
  undefined4 in_stack_fffffffffffff98c;
  undefined4 in_stack_fffffffffffff990;
  undefined4 in_stack_fffffffffffff994;
  uint in_stack_fffffffffffff998;
  FULLPEL_MV FVar12;
  undefined4 in_stack_fffffffffffff9a0;
  undefined4 in_stack_fffffffffffff9a4;
  int in_stack_fffffffffffff9a8;
  undefined4 in_stack_fffffffffffff9ac;
  MACROBLOCK *in_stack_fffffffffffff9b0;
  int in_stack_fffffffffffff9b8;
  int in_stack_fffffffffffff9bc;
  int in_stack_fffffffffffff9c0;
  int in_stack_fffffffffffff9c4;
  undefined4 in_stack_fffffffffffff9c8;
  int in_stack_fffffffffffff9cc;
  int in_stack_fffffffffffff9d0;
  undefined4 in_stack_fffffffffffff9d4;
  BLOCK_SIZE BVar13;
  int in_stack_fffffffffffff9d8;
  undefined4 in_stack_fffffffffffff9dc;
  AV1_COMP *in_stack_fffffffffffff9e0;
  undefined4 in_stack_fffffffffffff9e8;
  undefined4 in_stack_fffffffffffff9ec;
  int_mv in_stack_fffffffffffff9f0;
  undefined4 in_stack_fffffffffffff9f4;
  FULLPEL_MV in_stack_fffffffffffff9f8;
  undefined4 in_stack_fffffffffffff9fc;
  MV in_stack_fffffffffffffa00;
  int in_stack_fffffffffffffa04;
  FULLPEL_MOTION_SEARCH_PARAMS *in_stack_fffffffffffffa08;
  FULLPEL_MV in_stack_fffffffffffffa14;
  search_site_config *in_stack_fffffffffffffa20;
  undefined8 in_stack_fffffffffffffa28;
  undefined8 in_stack_fffffffffffffa30;
  SubpelMvLimits aSStack_578 [5];
  buf_2d *in_stack_fffffffffffffad8;
  buf_2d *in_stack_fffffffffffffae0;
  int *in_stack_fffffffffffffae8;
  int in_stack_fffffffffffffaf4;
  FULLPEL_MOTION_SEARCH_PARAMS *in_stack_fffffffffffffaf8;
  FULLPEL_MV in_stack_fffffffffffffb00;
  FULLPEL_MV *in_stack_fffffffffffffb10;
  search_site in_stack_fffffffffffffb18;
  search_site in_stack_fffffffffffffb20;
  int local_4d4;
  int local_4bc;
  FULLPEL_MV local_4a8;
  undefined1 local_494 [2];
  TX_SIZE tx_size;
  BLOCK_SIZE bs;
  int16_t iVar14;
  FULLPEL_MV in_stack_fffffffffffffb70;
  FULLPEL_MV in_stack_fffffffffffffb74;
  FULLPEL_MV in_stack_fffffffffffffb78;
  FULLPEL_MV in_stack_fffffffffffffb7c;
  search_site in_stack_fffffffffffffb80;
  search_site in_stack_fffffffffffffb88;
  FULLPEL_MV local_398;
  FULLPEL_MV_STATS local_394;
  int local_388 [6];
  search_site local_370;
  search_site local_368;
  byte local_359;
  search_site local_358;
  FULLPEL_MV local_34c;
  FULLPEL_MV local_348;
  FULLPEL_MV local_344;
  search_site local_340;
  byte local_331;
  FULLPEL_MV local_330;
  FULLPEL_MV local_32c;
  search_site local_328;
  FULLPEL_MV local_31c;
  FULLPEL_MV local_318;
  FULLPEL_MV local_314;
  FULLPEL_MV local_310;
  FULLPEL_MV local_30c;
  FULLPEL_MV local_308;
  FULLPEL_MV aFStack_304 [132];
  FULLPEL_MV local_f4;
  FULLPEL_MV local_f0;
  FULLPEL_MV local_ec;
  int_mv local_e8;
  int_mv local_e4;
  FULLPEL_MV local_e0;
  FULLPEL_MV local_dc;
  search_site local_d8;
  FULLPEL_MV local_d0;
  FULLPEL_MV local_cc;
  search_site local_c8;
  FULLPEL_MV local_c0;
  FULLPEL_MV local_bc;
  undefined8 local_b8 [12];
  search_site local_58;
  FULLPEL_MV local_4c;
  search_site local_48;
  search_site local_40;
  search_site local_38;
  FULLPEL_MV local_2c;
  search_site local_28;
  FULLPEL_MV local_20;
  search_site local_18;
  search_site local_10;
  
  local_38 = (search_site)((long)in_RSI + 0x1a0);
  local_40 = (search_site)((long)in_RDI + 0x3bf80);
  local_48 = (search_site)((long)in_RDI + 0x60df8);
  local_2c = in_R9D;
  local_28 = in_R8;
  local_20 = in_ECX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_4c = (FULLPEL_MV)av1_num_planes((AV1_COMMON *)local_40);
  local_58 = **(search_site **)((long)local_38 + 0x1eb8);
  memset(local_b8,0,0x60);
  local_bc.row = -1;
  local_bc.col = 0x7fff;
  local_c0 = (FULLPEL_MV)(int)((MV_REFERENCE_FRAME *)((long)local_58 + 0x10))[(int)local_20];
  local_c8 = (search_site)
             av1_get_scaled_ref_frame
                       ((AV1_COMP *)CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980),
                        (int)((ulong)in_stack_fffffffffffff978 >> 0x20));
  local_cc = *(FULLPEL_MV *)local_38;
  local_d0 = *(FULLPEL_MV *)((long)local_38 + 4);
  local_d8 = *(search_site *)((long)local_18 + 0xb9c8);
  if (local_c8 != (search_site)0x0) {
    local_dc.row = 0;
    local_dc.col = 0;
    for (; (int)local_dc < (int)local_4c; local_dc = (FULLPEL_MV)((int)local_dc + 1)) {
      lVar9 = (long)(int)local_dc;
      puVar10 = (undefined8 *)
                ((undefined4 *)((long)local_38 + (long)(int)local_dc * 0xa30) +
                (long)(int)local_20 * 8 + 0x10);
      local_b8[lVar9 * 4] = *puVar10;
      local_b8[lVar9 * 4 + 1] = puVar10[1];
      local_b8[lVar9 * 4 + 2] = puVar10[2];
      local_b8[lVar9 * 4 + 3] = puVar10[3];
    }
    in_stack_fffffffffffff968.mv = local_4c;
    av1_setup_pre_planes
              ((MACROBLOCKD *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
               in_stack_fffffffffffff9cc,
               (YV12_BUFFER_CONFIG *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
               in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8,
               (scale_factors *)in_stack_fffffffffffff9b0,in_stack_fffffffffffff9f0.as_int);
  }
  BVar13 = (BLOCK_SIZE)((uint)in_stack_fffffffffffff9d4 >> 0x18);
  if ((*(int *)((long)local_10 + 0x609f0) == 0) || (*(int *)((long)local_40 + 0x1e0) == 0)) {
    local_e0 = *(FULLPEL_MV *)((long)local_48 + 4);
  }
  else {
    iVar3 = av1_init_search_range(*(int *)((long)local_18 + 0x1f6c4 + (long)(int)local_c0 * 4));
    local_e0 = (FULLPEL_MV)((iVar3 + *(int *)((long)local_48 + 4)) / 2);
  }
  local_e8 = av1_get_ref_mv((MACROBLOCK *)
                            CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988),
                            in_stack_fffffffffffff984);
  local_e4 = local_e8;
  if (*(MOTION_MODE *)((long)local_58 + 0x18) == '\0') {
    local_f4 = get_fullmv_from_mv(&local_e4.as_mv);
    local_ec = local_f4;
  }
  else {
    local_f0 = get_fullmv_from_mv((MV *)((long)local_58 + 8));
    local_ec = local_f0;
  }
  memset(&local_308,0,0x208);
  local_308 = local_ec;
  local_30c.row = 1;
  local_30c.col = 0;
  local_310.row = 0;
  local_310.col = 0;
  if ((*(int *)((long)local_10 + 0x60a54) == 0) && (*(MOTION_MODE *)((long)local_58 + 0x18) == '\0')
     ) {
    in_stack_fffffffffffff968 = (search_site)&local_310;
    get_mv_candidate_from_tpl
              (in_stack_fffffffffffff9e0,
               (MACROBLOCK *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),BVar13,
               in_stack_fffffffffffff9d0,
               (cand_mv_t *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
               (int *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
               (int *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0.as_int));
  }
  FVar12 = local_30c;
  if (2 < (int)local_30c) {
    FVar12.row = 2;
    FVar12.col = 0;
  }
  if ((*(int *)((long)local_10 + 0x60a68) != 0) && (*(MOTION_MODE *)((long)local_58 + 0x18) == '\0')
     ) {
    local_318 = *(FULLPEL_MV *)(in_stack_00000018 + 0x14a4);
    local_31c.row = 0;
    local_31c.col = 0;
    for (; (int)local_31c < (int)FVar12; local_31c = (FULLPEL_MV)((int)local_31c + 1)) {
      local_328 = (search_site)(aFStack_304 + (long)(int)local_31c * 2 + -1);
      local_32c.row = 0;
      local_32c.col = 0;
      local_330.row = 0;
      local_330.col = 0;
      for (; (int)local_330 < (int)local_318; local_330 = (FULLPEL_MV)((int)local_330 + 1)) {
        local_331 = *(byte *)(in_stack_00000018 + 0x14a0 + (long)(int)local_330);
        local_340 = (search_site)(in_stack_00000018 + 0x1490 + (long)(int)local_330 * 4);
        local_344 = *(FULLPEL_MV *)
                     (*(long *)(in_stack_00000018 + 0x60) + (ulong)local_331 * 0x20 +
                     (long)(int)local_c0 * 4);
        local_348 = (FULLPEL_MV)((int)*(short *)local_340 - (int)*(short *)local_328);
        if ((int)local_348 < 1) {
          local_348 = (FULLPEL_MV)-(int)local_348;
        }
        local_34c = (FULLPEL_MV)
                    ((int)*(short *)((long)local_340 + 2) -
                    (int)aFStack_304[(long)(int)local_31c * 2 + -1].col);
        if ((int)local_34c < 1) {
          local_34c = (FULLPEL_MV)-(int)local_34c;
        }
        if (local_344 != (FULLPEL_MV)0x0) {
          if (*(int *)((long)local_10 + 0x60a68) < 2) {
            if ((0 < *(int *)((long)local_10 + 0x60a68)) && ((int)local_348 + (int)local_34c < 2)) {
              local_32c.row = 1;
              local_32c.col = 0;
              break;
            }
          }
          else if (((int)local_348 < 2) && ((int)local_34c < 2)) {
            local_32c.row = 1;
            local_32c.col = 0;
            break;
          }
        }
      }
      if (local_32c == (FULLPEL_MV)0x0) {
        if (((byte)(*(ushort *)((long)local_58 + 0xa7) >> 4) & 3) != 2) {
          *(FULLPEL_MV *)
           (in_stack_00000018 + 0x1490 + (long)*(int *)(in_stack_00000018 + 0x14a4) * 4) =
               *(FULLPEL_MV *)local_328;
          *(byte *)(in_stack_00000018 + 0x14a0 + (long)*(int *)(in_stack_00000018 + 0x14a4)) =
               (byte)(*(ushort *)((long)local_58 + 0xa7) >> 4) & 3;
          *(int *)(in_stack_00000018 + 0x14a4) = *(int *)(in_stack_00000018 + 0x14a4) + 1;
        }
      }
      else {
        aFStack_304[(long)(int)local_31c * 2 + -1].row = -0x8000;
        aFStack_304[(long)(int)local_31c * 2 + -1].col = -0x8000;
      }
    }
  }
  local_358 = (search_site)((long)local_10 + 0x609e8);
  local_314 = FVar12;
  local_359 = av1_get_default_mv_search_method
                        ((MACROBLOCK *)CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990)
                         ,(MV_SPEED_FEATURES *)
                          CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988),
                         (BLOCK_SIZE)(in_stack_fffffffffffff984 >> 0x18));
  local_368 = (search_site)
              av1_get_search_site_config
                        ((AV1_COMP *)&in_stack_fffffffffffff978->as_mv,
                         (MACROBLOCK *)&in_stack_fffffffffffff970->as_mv,
                         in_stack_fffffffffffff968.offset._3_1_);
  uVar8 = in_stack_fffffffffffff998;
  if ((int)local_2c < 0x7fffffff) {
    local_370 = (search_site)((long)local_368 + (ulong)""[local_359] * 0xc68);
    if ((int)local_2c < 1) {
      local_e0 = *(FULLPEL_MV *)((long)local_370 + 0xbb0);
    }
    else {
      while( true ) {
        iVar3 = ((int *)((long)local_370 + 0xc0c))
                [(*(int *)((long)local_370 + 0xbb0) - (int)local_e0) + -1];
        uVar8 = in_stack_fffffffffffff998 & 0xffffff;
        if (iVar3 != (int)local_2c * 2 &&
            SBORROW4(iVar3,(int)local_2c * 2) == iVar3 + (int)local_2c * -2 < 0) {
          uVar8 = CONCAT13(0 < (*(int *)((long)local_370 + 0xbb0) - (int)local_e0) + -1,
                           (int3)in_stack_fffffffffffff998);
        }
        if ((char)(uVar8 >> 0x18) == '\0') break;
        local_e0 = (FULLPEL_MV)((int)local_e0 + 1);
        in_stack_fffffffffffff998 = uVar8;
      }
    }
  }
  local_398.row = -0x8000;
  local_398.col = -0x8000;
  in_stack_00000010->row = -0x8000;
  in_stack_00000010->col = -0x8000;
  iVar3 = use_fine_search_interval((AV1_COMP *)local_10);
  if (*(MOTION_MODE *)((long)local_58 + 0x18) == '\0') {
    in_stack_fffffffffffffb7c.row = 0;
    in_stack_fffffffffffffb7c.col = 0;
    in_stack_fffffffffffffb78.row = 0;
    in_stack_fffffffffffffb78.col = 0;
    for (; (int)in_stack_fffffffffffffb78 < (int)local_314;
        in_stack_fffffffffffffb78 = (FULLPEL_MV)((int)in_stack_fffffffffffffb78 + 1)) {
      in_stack_fffffffffffffb74 = aFStack_304[(long)(int)in_stack_fffffffffffffb78 * 2 + -1];
      if (in_stack_fffffffffffffb74 != (FULLPEL_MV)0x80008000) {
        in_stack_fffffffffffff970 =
             (int_mv *)CONCAT44((int)((ulong)in_stack_fffffffffffff970 >> 0x20),(uint)local_359);
        in_stack_fffffffffffff978 =
             (int_mv *)CONCAT44((int)((ulong)in_stack_fffffffffffff978 >> 0x20),iVar3);
        av1_make_default_fullpel_ms_params
                  (in_stack_fffffffffffffa08,
                   (AV1_COMP *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                   (MACROBLOCK *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                   (BLOCK_SIZE)((uint)in_stack_fffffffffffff9f4 >> 0x18),
                   (MV *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
                   in_stack_fffffffffffffa14,in_stack_fffffffffffffa20,
                   (SEARCH_METHODS)in_stack_fffffffffffffa28,(int)in_stack_fffffffffffffa30);
        cond_cost_list((AV1_COMP *)local_10,local_388);
        in_stack_fffffffffffff968 = (search_site)local_494;
        FVar4 = (FULLPEL_MV)
                av1_full_pixel_search
                          (in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,
                           in_stack_fffffffffffffaf4,in_stack_fffffffffffffae8,
                           (FULLPEL_MV *)in_stack_fffffffffffffae0,
                           (FULLPEL_MV_STATS *)in_stack_fffffffffffffad8,in_stack_fffffffffffffb10);
        if ((int)FVar4 < (int)local_bc) {
          local_bc = FVar4;
          *in_stack_00000010 = in_stack_fffffffffffffb70;
          local_398 = _local_494;
        }
        in_stack_fffffffffffffb7c =
             (FULLPEL_MV)
             ((int)aFStack_304[(long)(int)in_stack_fffffffffffffb78 * 2] +
             (int)in_stack_fffffffffffffb7c);
        iVar7 = (int)in_stack_fffffffffffffb7c * 4;
        if (iVar7 != (int)local_310 * 3 &&
            SBORROW4(iVar7,(int)local_310 * 3) == iVar7 + (int)local_310 * -3 < 0) break;
      }
    }
  }
  else if (*(MOTION_MODE *)((long)local_58 + 0x18) == '\x01') {
    in_stack_fffffffffffff970 =
         (int_mv *)CONCAT44((int)((ulong)in_stack_fffffffffffff970 >> 0x20),(uint)local_359);
    in_stack_fffffffffffff978 =
         (int_mv *)CONCAT44((int)((ulong)in_stack_fffffffffffff978 >> 0x20),iVar3);
    in_stack_fffffffffffff968 = local_368;
    av1_make_default_fullpel_ms_params
              (in_stack_fffffffffffffa08,
               (AV1_COMP *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
               (MACROBLOCK *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
               (BLOCK_SIZE)((uint)in_stack_fffffffffffff9f4 >> 0x18),
               (MV *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
               in_stack_fffffffffffffa14,in_stack_fffffffffffffa20,
               (SEARCH_METHODS)in_stack_fffffffffffffa28,(int)in_stack_fffffffffffffa30);
    local_bc = (FULLPEL_MV)
               av1_obmc_full_pixel_search
                         (in_stack_fffffffffffff980,
                          (FULLPEL_MOTION_SEARCH_PARAMS *)&in_stack_fffffffffffff978->as_mv,
                          (int)((ulong)in_stack_fffffffffffff970 >> 0x20),
                          (FULLPEL_MV *)in_stack_fffffffffffff968);
  }
  if (*in_stack_00000010 != (FULLPEL_MV)0x80008000) {
    if (local_c8 != (search_site)0x0) {
      local_4a8.row = 0;
      local_4a8.col = 0;
      for (; (int)local_4a8 < (int)local_4c; local_4a8 = (FULLPEL_MV)((int)local_4a8 + 1)) {
        puVar10 = (undefined8 *)
                  ((undefined4 *)((long)local_38 + (long)(int)local_4a8 * 0xa30) +
                  (long)(int)local_20 * 8 + 0x10);
        lVar9 = (long)(int)local_4a8;
        *puVar10 = local_b8[lVar9 * 4];
        puVar10[1] = local_b8[lVar9 * 4 + 1];
        puVar10[2] = local_b8[lVar9 * 4 + 2];
        puVar10[3] = local_b8[lVar9 * 4 + 3];
      }
    }
    if (((1 < *(int *)((long)local_10 + 0x60aa4)) &&
        (*(MOTION_MODE *)((long)local_58 + 0x18) == '\0')) &&
       (*in_stack_00000010 != (FULLPEL_MV)0x80008000)) {
      MVar5 = get_mv_from_fullmv(in_stack_00000010);
      uVar6 = (uint)((byte)(*(ushort *)((long)local_58 + 0xa7) >> 4) & 3);
      iVar3 = av1_mv_bit_cost((MV *)CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980),
                              &in_stack_fffffffffffff978->as_mv,
                              (int *)&in_stack_fffffffffffff970->as_int,
                              (int **)in_stack_fffffffffffff968,0);
      *(MV *)(in_stack_00000008 + (long)(int)uVar6 * 0x14 + 4) = MVar5;
      *(int *)(in_stack_00000008 + (long)(int)uVar6 * 0x14 + 8) = iVar3;
      *(FULLPEL_MV *)(in_stack_00000008 + (long)(int)uVar6 * 0x14 + 0xc) = local_bc;
      for (local_4bc = 0; local_4bc < (int)uVar6; local_4bc = local_4bc + 1) {
        if ((MVar5 == *(MV *)(in_stack_00000008 + (long)local_4bc * 0x14 + 4)) &&
           (*(int *)(in_stack_00000008 + (long)local_4bc * 0x14 + 8) +
            *(int *)(in_stack_00000008 + (long)local_4bc * 0x14) <=
            iVar3 + *(int *)(in_stack_00000008 + (long)(int)uVar6 * 0x14))) {
          in_stack_00000010->row = -0x8000;
          in_stack_00000010->col = -0x8000;
          return;
        }
        iVar7 = *(int *)(in_stack_00000008 + (long)local_4bc * 0x14 + 0xc);
        if (iVar7 != 0x7fffffff) {
          if (*(int *)((long)local_10 + 0x60aa4) == 3) {
            iVar7 = iVar7 + (iVar7 >> 2);
          }
          if (((2 < *(int *)((long)local_10 + 0x60aa4)) &&
              (iVar7 < *(int *)(in_stack_00000008 + (long)(int)uVar6 * 0x14 + 0xc))) &&
             (*(int *)(in_stack_00000008 + (long)local_4bc * 0x14) <
              *(int *)(in_stack_00000008 + (long)(int)uVar6 * 0x14))) {
            in_stack_00000010->row = -0x8000;
            in_stack_00000010->col = -0x8000;
            return;
          }
        }
      }
    }
    if ((*(_Bool *)((long)local_10 + 0x3c16e) & 1U) != 0) {
      convert_fullmv_to_mv(in_stack_fffffffffffff970);
    }
    bVar11 = false;
    if ((int)local_bc < 0x7fffffff) {
      bVar11 = (*(_Bool *)((long)local_10 + 0x3c16e) & 1U) == 0;
    }
    local_4d4 = 0;
    bVar1 = false;
    if (bVar11) {
      av1_set_fractional_mv((int_mv *)&stack0xfffffffffffffb1c);
      av1_make_default_subpel_ms_params
                ((SUBPEL_MOTION_SEARCH_PARAMS *)
                 CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
                 (AV1_COMP *)CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8),
                 in_stack_fffffffffffff9b0,(BLOCK_SIZE)((uint)in_stack_fffffffffffff9ac >> 0x18),
                 (MV *)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
                 (int *)CONCAT44(FVar12,uVar8));
      BVar13 = (BLOCK_SIZE)((uint)in_stack_fffffffffffff9a4 >> 0x18);
      MVar5 = get_mv_from_fullmv(in_stack_00000010);
      in_stack_fffffffffffff984 = (uint)*(MOTION_MODE *)((long)local_58 + 0x18);
      if (in_stack_fffffffffffff984 == 0) {
        if (*(SUBPEL_SEARCH_TYPE *)((long)local_358 + 0x16) == '\0') {
          in_stack_fffffffffffff970 = (int_mv *)((long)local_18 + 0x25660 + (long)(int)local_c0 * 4)
          ;
          in_stack_fffffffffffff968 = (search_site)&stack0xfffffffffffffb18;
          in_stack_fffffffffffff978 = (int_mv *)0x0;
          (**(fractional_mv_step_fp **)((long)local_48 + 8))
                    ((MACROBLOCKD *)local_38,(AV1_COMMON *)local_40,
                     (SUBPEL_MOTION_SEARCH_PARAMS *)&stack0xfffffffffffffa70,MVar5,&local_394,
                     (MV *)in_stack_00000010,(int *)in_stack_fffffffffffff968,
                     &in_stack_fffffffffffff970->as_int,(int_mv *)0x0);
        }
        else {
          FVar4 = (FULLPEL_MV)((uint)in_stack_fffffffffffff980 & 0xffffff);
          if ((local_398 != (FULLPEL_MV)0x80008000) &&
             (FVar4 = (FULLPEL_MV)((uint)in_stack_fffffffffffff980 & 0xffffff),
             local_398 != *in_stack_00000010)) {
            FVar4._0_3_ = in_stack_fffffffffffff980._0_3_;
            FVar4.col._1_1_ = *(int *)((long)local_358 + 0x7c) < 2;
          }
          uVar8 = (uint)FVar4 >> 0x18;
          in_stack_fffffffffffff970 = (int_mv *)((long)local_18 + 0x25660 + (long)(int)local_c0 * 4)
          ;
          in_stack_fffffffffffff978 = (int_mv *)&stack0xfffffffffffffb1c;
          in_stack_fffffffffffff968 = (search_site)&stack0xfffffffffffffb18;
          iVar3 = (**(fractional_mv_step_fp **)((long)local_48 + 8))
                            ((MACROBLOCKD *)local_38,(AV1_COMMON *)local_40,
                             (SUBPEL_MOTION_SEARCH_PARAMS *)&stack0xfffffffffffffa70,MVar5,
                             &local_394,(MV *)in_stack_00000010,(int *)in_stack_fffffffffffff968,
                             &in_stack_fffffffffffff970->as_int,in_stack_fffffffffffff978);
          in_stack_fffffffffffff980 = FVar4;
          if (uVar8 != 0) {
            lVar9 = 0x7fffffffffffffff;
            if (*(int *)((long)local_358 + 0x7c) == 0) {
              *(FULLPEL_MV *)((long)local_58 + 8) = *in_stack_00000010;
              in_stack_fffffffffffff968 =
                   (search_site)((ulong)in_stack_fffffffffffff968 & 0xffffffff00000000);
              in_stack_fffffffffffff970 =
                   (int_mv *)((ulong)in_stack_fffffffffffff970 & 0xffffffff00000000);
              av1_enc_build_inter_predictor
                        ((AV1_COMMON *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0)
                         ,(MACROBLOCKD *)
                          CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8),
                         (int)((ulong)in_stack_fffffffffffff9b0 >> 0x20),
                         (int)in_stack_fffffffffffff9b0,
                         (BUFFER_SET *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8)
                         ,BVar13,in_stack_fffffffffffff9d0,in_stack_fffffffffffff9d8);
              av1_subtract_plane(in_stack_fffffffffffff9b0,
                                 (BLOCK_SIZE)((uint)in_stack_fffffffffffff9ac >> 0x18),
                                 in_stack_fffffffffffff9a8);
              av1_init_rd_stats((RD_STATS *)&stack0xfffffffffffffa00);
              iVar2 = iVar14;
              bs = (BLOCK_SIZE)((ushort)iVar14 >> 8);
              tx_size = (TX_SIZE)iVar2;
              av1_estimate_txfm_yrd
                        ((AV1_COMP *)in_stack_fffffffffffffb88,
                         (MACROBLOCK *)in_stack_fffffffffffffb80,
                         (RD_STATS *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
                         CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),bs,tx_size);
              iVar14 = iVar2;
              iVar7 = av1_mv_bit_cost((MV *)CONCAT44(in_stack_fffffffffffff984,FVar4),
                                      &in_stack_fffffffffffff978->as_mv,
                                      (int *)&in_stack_fffffffffffff970->as_int,
                                      (int **)in_stack_fffffffffffff968,0);
              lVar9 = ((long)(iVar7 + (int)in_stack_fffffffffffffa00) *
                       (long)*(int *)((long)local_18 + 0x4218) + 0x100 >> 9) +
                      (long)in_stack_fffffffffffffa08 * 0x80;
            }
            MVar5 = get_mv_from_fullmv(&local_398);
            iVar7 = av1_is_subpelmv_in_range(aSStack_578,MVar5);
            in_stack_fffffffffffff980 = FVar4;
            if (iVar7 != 0) {
              in_stack_fffffffffffff978 = (int_mv *)&stack0xfffffffffffffb1c;
              in_stack_fffffffffffff968 = (search_site)&stack0xfffffffffffffb18;
              in_stack_fffffffffffff970 = (int_mv *)&stack0xfffffffffffff9f0;
              iVar7 = (**(fractional_mv_step_fp **)((long)local_48 + 8))
                                ((MACROBLOCKD *)local_38,(AV1_COMMON *)local_40,
                                 (SUBPEL_MOTION_SEARCH_PARAMS *)&stack0xfffffffffffffa70,MVar5,
                                 (FULLPEL_MV_STATS *)0x0,(MV *)&stack0xfffffffffffff9f8,
                                 (int *)in_stack_fffffffffffff968,&in_stack_fffffffffffff970->as_int
                                 ,in_stack_fffffffffffff978);
              if (*(int *)((long)local_358 + 0x7c) == 0) {
                *(FULLPEL_MV *)((long)local_58 + 8) = in_stack_fffffffffffff9f8;
                in_stack_fffffffffffff968 =
                     (search_site)((ulong)in_stack_fffffffffffff968 & 0xffffffff00000000);
                in_stack_fffffffffffff970 =
                     (int_mv *)((ulong)in_stack_fffffffffffff970 & 0xffffffff00000000);
                av1_enc_build_inter_predictor
                          ((AV1_COMMON *)
                           CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
                           (MACROBLOCKD *)
                           CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8),
                           (int)((ulong)in_stack_fffffffffffff9b0 >> 0x20),
                           (int)in_stack_fffffffffffff9b0,
                           (BUFFER_SET *)
                           CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8),BVar13,
                           in_stack_fffffffffffff9d0,in_stack_fffffffffffff9d8);
                av1_subtract_plane(in_stack_fffffffffffff9b0,
                                   (BLOCK_SIZE)((uint)in_stack_fffffffffffff9ac >> 0x18),
                                   in_stack_fffffffffffff9a8);
                av1_init_rd_stats((RD_STATS *)&stack0xfffffffffffff9c0);
                iVar2 = iVar14;
                bs = (BLOCK_SIZE)((ushort)iVar14 >> 8);
                tx_size = (TX_SIZE)iVar2;
                av1_estimate_txfm_yrd
                          ((AV1_COMP *)in_stack_fffffffffffffb88,
                           (MACROBLOCK *)in_stack_fffffffffffffb80,
                           (RD_STATS *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78)
                           ,CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),bs,tx_size
                          );
                iVar3 = av1_mv_bit_cost((MV *)CONCAT44(in_stack_fffffffffffff984,FVar4),
                                        &in_stack_fffffffffffff978->as_mv,
                                        (int *)&in_stack_fffffffffffff970->as_int,
                                        (int **)in_stack_fffffffffffff968,0);
                in_stack_fffffffffffff980 = FVar4;
                if (((long)(in_stack_fffffffffffff9c0 + iVar3) *
                     (long)*(int *)((long)local_18 + 0x4218) + 0x100 >> 9) +
                    CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8) * 0x80 < lVar9) {
                  *in_stack_00000010 = in_stack_fffffffffffff9f8;
                  *(int_mv *)((long)local_18 + 0x25660 + (long)(int)local_c0 * 4) =
                       in_stack_fffffffffffff9f0;
                }
              }
              else {
                in_stack_fffffffffffff980 = FVar4;
                if (iVar7 < iVar3) {
                  *in_stack_00000010 = in_stack_fffffffffffff9f8;
                  *(int_mv *)((long)local_18 + 0x25660 + (long)(int)local_c0 * 4) =
                       in_stack_fffffffffffff9f0;
                }
              }
            }
          }
        }
      }
      else if (in_stack_fffffffffffff984 == 1) {
        in_stack_fffffffffffff970 = (int_mv *)((long)local_18 + 0x25660 + (long)(int)local_c0 * 4);
        in_stack_fffffffffffff968 = (search_site)&stack0xfffffffffffffb18;
        in_stack_fffffffffffff978 = (int_mv *)0x0;
        av1_find_best_obmc_sub_pixel_tree_up
                  ((MACROBLOCKD *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                   (AV1_COMMON *)
                   CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0.as_int),
                   (SUBPEL_MOTION_SEARCH_PARAMS *)
                   CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
                   in_stack_fffffffffffffa00,(FULLPEL_MV_STATS *)in_stack_fffffffffffff9e0,
                   (MV *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),
                   (int *)in_stack_fffffffffffffb10,(uint *)in_stack_fffffffffffffb18,
                   (int_mv *)in_stack_fffffffffffffb20);
      }
      if ((((0 < *(int *)((long)local_10 + 0x60aa4)) && (in_stack_00000018 != 0)) &&
          (*(MOTION_MODE *)((long)local_58 + 0x18) == '\0')) &&
         (*in_stack_00000010 != (FULLPEL_MV)0x80008000)) {
        uVar8 = (uint)((byte)(*(ushort *)((long)local_58 + 0xa7) >> 4) & 3);
        local_4d4 = av1_mv_bit_cost((MV *)CONCAT44(in_stack_fffffffffffff984,
                                                   in_stack_fffffffffffff980),
                                    &in_stack_fffffffffffff978->as_mv,
                                    (int *)&in_stack_fffffffffffff970->as_int,
                                    (int **)in_stack_fffffffffffff968,0);
        bVar1 = true;
        for (iVar3 = 0; iVar3 < (int)uVar8; iVar3 = iVar3 + 1) {
          if ((*(int *)(*(long *)(in_stack_00000018 + 0x60) + (long)iVar3 * 0x20 +
                       (long)(int)local_c0 * 4) != 0) &&
             (*in_stack_00000010 ==
              *(FULLPEL_MV *)
               (*(long *)(in_stack_00000018 + 0x50) + (long)iVar3 * 0x20 + (long)(int)local_c0 * 4))
             ) {
            if (*(int *)(in_stack_00000008 + (long)iVar3 * 0x14 + 0x10) != 0) {
              *(undefined4 *)(in_stack_00000008 + (long)(int)uVar8 * 0x14 + 0x10) = 1;
              break;
            }
            if (*(int *)(*(long *)(in_stack_00000018 + 0x58) + (long)iVar3 * 0x20 +
                        (long)(int)local_c0 * 4) + *(int *)(in_stack_00000008 + (long)iVar3 * 0x14)
                <= local_4d4 + *(int *)(in_stack_00000008 + (long)(int)uVar8 * 0x14)) {
              *(undefined4 *)(in_stack_00000008 + (long)(int)uVar8 * 0x14 + 0x10) = 1;
              break;
            }
          }
        }
      }
    }
    if (bVar1) {
      *(int *)local_28 = local_4d4;
    }
    else {
      iVar3 = av1_mv_bit_cost((MV *)CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980),
                              &in_stack_fffffffffffff978->as_mv,
                              (int *)&in_stack_fffffffffffff970->as_int,
                              (int **)in_stack_fffffffffffff968,0);
      *(int *)local_28 = iVar3;
    }
  }
  return;
}

Assistant:

void av1_single_motion_search(const AV1_COMP *const cpi, MACROBLOCK *x,
                              BLOCK_SIZE bsize, int ref_idx, int *rate_mv,
                              int search_range, inter_mode_info *mode_info,
                              int_mv *best_mv,
                              struct HandleInterModeArgs *const args) {
  MACROBLOCKD *xd = &x->e_mbd;
  const AV1_COMMON *cm = &cpi->common;
  const MotionVectorSearchParams *mv_search_params = &cpi->mv_search_params;
  const int num_planes = av1_num_planes(cm);
  MB_MODE_INFO *mbmi = xd->mi[0];
  struct buf_2d backup_yv12[MAX_MB_PLANE] = { { 0, 0, 0, 0, 0 } };
  int bestsme = INT_MAX;
  const int ref = mbmi->ref_frame[ref_idx];
  const YV12_BUFFER_CONFIG *scaled_ref_frame =
      av1_get_scaled_ref_frame(cpi, ref);
  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;
  const MvCosts *mv_costs = x->mv_costs;

  if (scaled_ref_frame) {
    // Swap out the reference frame for a version that's been scaled to
    // match the resolution of the current frame, allowing the existing
    // full-pixel motion search code to be used without additional
    // modifications.
    for (int i = 0; i < num_planes; i++) {
      backup_yv12[i] = xd->plane[i].pre[ref_idx];
    }
    av1_setup_pre_planes(xd, ref_idx, scaled_ref_frame, mi_row, mi_col, NULL,
                         num_planes);
  }

  // Work out the size of the first step in the mv step search.
  // 0 here is maximum length first step. 1 is AOMMAX >> 1 etc.
  int step_param;
  if (cpi->sf.mv_sf.auto_mv_step_size && cm->show_frame) {
    // Take the weighted average of the step_params based on the last frame's
    // max mv magnitude and that based on the best ref mvs of the current
    // block for the given reference.
    step_param = (av1_init_search_range(x->max_mv_context[ref]) +
                  mv_search_params->mv_step_param) /
                 2;
  } else {
    step_param = mv_search_params->mv_step_param;
  }

  const MV ref_mv = av1_get_ref_mv(x, ref_idx).as_mv;
  FULLPEL_MV start_mv;
  if (mbmi->motion_mode != SIMPLE_TRANSLATION)
    start_mv = get_fullmv_from_mv(&mbmi->mv[0].as_mv);
  else
    start_mv = get_fullmv_from_mv(&ref_mv);

  // cand stores start_mv and all possible MVs in a SB.
  cand_mv_t cand[MAX_TPL_BLK_IN_SB * MAX_TPL_BLK_IN_SB + 1];
  av1_zero(cand);
  cand[0].fmv.as_fullmv = start_mv;
  int cnt = 1;
  int total_weight = 0;

  if (!cpi->sf.mv_sf.full_pixel_search_level &&
      mbmi->motion_mode == SIMPLE_TRANSLATION) {
    get_mv_candidate_from_tpl(cpi, x, bsize, ref, cand, &cnt, &total_weight);
  }

  const int cand_cnt = AOMMIN(2, cnt);
  // TODO(any): Test the speed feature for OBMC_CAUSAL mode.
  if (cpi->sf.mv_sf.skip_fullpel_search_using_startmv &&
      mbmi->motion_mode == SIMPLE_TRANSLATION) {
    const int stack_size = args->start_mv_cnt;
    for (int cand_idx = 0; cand_idx < cand_cnt; cand_idx++) {
      int_mv *fmv_cand = &cand[cand_idx].fmv;
      int skip_cand_mv = 0;

      // Check difference between mvs in the stack and candidate mv.
      for (int stack_idx = 0; stack_idx < stack_size; stack_idx++) {
        const uint8_t this_ref_mv_idx = args->ref_mv_idx_stack[stack_idx];
        const FULLPEL_MV *fmv_stack = &args->start_mv_stack[stack_idx];
        const int this_newmv_valid =
            args->single_newmv_valid[this_ref_mv_idx][ref];
        const int row_diff = abs(fmv_stack->row - fmv_cand->as_fullmv.row);
        const int col_diff = abs(fmv_stack->col - fmv_cand->as_fullmv.col);

        if (!this_newmv_valid) continue;

        if (cpi->sf.mv_sf.skip_fullpel_search_using_startmv >= 2) {
          // Prunes the current start_mv candidate, if the absolute mv
          // difference of both row and column are <= 1.
          if (row_diff <= 1 && col_diff <= 1) {
            skip_cand_mv = 1;
            break;
          }
        } else if (cpi->sf.mv_sf.skip_fullpel_search_using_startmv >= 1) {
          // Prunes the current start_mv candidate, if the sum of the absolute
          // mv difference of row and column is <= 1.
          if (row_diff + col_diff <= 1) {
            skip_cand_mv = 1;
            break;
          }
        }
      }
      if (skip_cand_mv) {
        // Ensure atleast one full-pel motion search is not pruned.
        assert(mbmi->ref_mv_idx != 0);
        // Mark the candidate mv as invalid so that motion search gets skipped.
        cand[cand_idx].fmv.as_int = INVALID_MV;
      } else {
        // Store start_mv candidate and corresponding ref_mv_idx of full-pel
        // search in the mv stack (except last ref_mv_idx).
        if (mbmi->ref_mv_idx != MAX_REF_MV_SEARCH - 1) {
          assert(args->start_mv_cnt < (MAX_REF_MV_SEARCH - 1) * 2);
          args->start_mv_stack[args->start_mv_cnt] = fmv_cand->as_fullmv;
          args->ref_mv_idx_stack[args->start_mv_cnt] = mbmi->ref_mv_idx;
          args->start_mv_cnt++;
        }
      }
    }
  }

  // Hot fix for asan complaints when resize mode is on. When resize mode is on,
  // the stride of the reference frame can be different from indicated by
  // MotionVectorSearchParams::search_site_cfg. When this happens, we need to
  // readjust the stride.
  const MV_SPEED_FEATURES *mv_sf = &cpi->sf.mv_sf;
  const SEARCH_METHODS search_method =
      av1_get_default_mv_search_method(x, mv_sf, bsize);
  const search_site_config *src_search_site_cfg =
      av1_get_search_site_config(cpi, x, search_method);

  // Further reduce the search range.
  if (search_range < INT_MAX) {
    const search_site_config *search_site_cfg =
        &src_search_site_cfg[search_method_lookup[search_method]];
    // Max step_param is search_site_cfg->num_search_steps.
    if (search_range < 1) {
      step_param = search_site_cfg->num_search_steps;
    } else {
      while (search_site_cfg->radius[search_site_cfg->num_search_steps -
                                     step_param - 1] > (search_range << 1) &&
             search_site_cfg->num_search_steps - step_param - 1 > 0)
        step_param++;
    }
  }

  int cost_list[5];
  FULLPEL_MV_STATS best_mv_stats;
  int_mv second_best_mv;
  best_mv->as_int = second_best_mv.as_int = INVALID_MV;

  // Allow more mesh searches for screen content type on the ARF.
  const int fine_search_interval = use_fine_search_interval(cpi);
  FULLPEL_MOTION_SEARCH_PARAMS full_ms_params;

  switch (mbmi->motion_mode) {
    case SIMPLE_TRANSLATION: {
      // Perform a search with the top 2 candidates
      int sum_weight = 0;
      for (int m = 0; m < cand_cnt; m++) {
        int_mv smv = cand[m].fmv;
        FULLPEL_MV this_best_mv, this_second_best_mv;
        FULLPEL_MV_STATS this_mv_stats;

        if (smv.as_int == INVALID_MV) continue;

        av1_make_default_fullpel_ms_params(
            &full_ms_params, cpi, x, bsize, &ref_mv, smv.as_fullmv,
            src_search_site_cfg, search_method, fine_search_interval);

        const int thissme =
            av1_full_pixel_search(smv.as_fullmv, &full_ms_params, step_param,
                                  cond_cost_list(cpi, cost_list), &this_best_mv,
                                  &this_mv_stats, &this_second_best_mv);

        if (thissme < bestsme) {
          bestsme = thissme;
          best_mv->as_fullmv = this_best_mv;
          best_mv_stats = this_mv_stats;
          second_best_mv.as_fullmv = this_second_best_mv;
        }

        sum_weight += cand[m].weight;
        if (4 * sum_weight > 3 * total_weight) break;
      }
    } break;
    case OBMC_CAUSAL:
      av1_make_default_fullpel_ms_params(&full_ms_params, cpi, x, bsize,
                                         &ref_mv, start_mv, src_search_site_cfg,
                                         search_method, fine_search_interval);

      bestsme = av1_obmc_full_pixel_search(start_mv, &full_ms_params,
                                           step_param, &best_mv->as_fullmv);
      break;
    default: assert(0 && "Invalid motion mode!\n");
  }
  if (best_mv->as_int == INVALID_MV) return;

  if (scaled_ref_frame) {
    // Swap back the original buffers for subpel motion search.
    for (int i = 0; i < num_planes; i++) {
      xd->plane[i].pre[ref_idx] = backup_yv12[i];
    }
  }

  // Terminate search with the current ref_idx based on fullpel mv, rate cost,
  // and other know cost.
  if (cpi->sf.inter_sf.skip_newmv_in_drl >= 2 &&
      mbmi->motion_mode == SIMPLE_TRANSLATION &&
      best_mv->as_int != INVALID_MV) {
    int_mv this_mv;
    this_mv.as_mv = get_mv_from_fullmv(&best_mv->as_fullmv);
    const int ref_mv_idx = mbmi->ref_mv_idx;
    const int this_mv_rate =
        av1_mv_bit_cost(&this_mv.as_mv, &ref_mv, mv_costs->nmv_joint_cost,
                        mv_costs->mv_cost_stack, MV_COST_WEIGHT);
    mode_info[ref_mv_idx].full_search_mv.as_int = this_mv.as_int;
    mode_info[ref_mv_idx].full_mv_rate = this_mv_rate;
    mode_info[ref_mv_idx].full_mv_bestsme = bestsme;

    for (int prev_ref_idx = 0; prev_ref_idx < ref_mv_idx; ++prev_ref_idx) {
      // Check if the motion search result same as previous results
      if (this_mv.as_int == mode_info[prev_ref_idx].full_search_mv.as_int) {
        // Compare the rate cost
        const int prev_rate_cost = mode_info[prev_ref_idx].full_mv_rate +
                                   mode_info[prev_ref_idx].drl_cost;
        const int this_rate_cost =
            this_mv_rate + mode_info[ref_mv_idx].drl_cost;

        if (prev_rate_cost <= this_rate_cost) {
          // If the current rate_cost is worse than the previous rate_cost, then
          // we terminate the search. Since av1_single_motion_search is only
          // called by handle_new_mv in SIMPLE_TRANSLATION mode, we set the
          // best_mv to INVALID mv to signal that we wish to terminate search
          // for the current mode.
          best_mv->as_int = INVALID_MV;
          return;
        }
      }

      // Terminate the evaluation of current ref_mv_idx based on bestsme and
      // drl_cost.
      const int psme = mode_info[prev_ref_idx].full_mv_bestsme;
      if (psme == INT_MAX) continue;
      const int thr =
          cpi->sf.inter_sf.skip_newmv_in_drl == 3 ? (psme + (psme >> 2)) : psme;
      if (cpi->sf.inter_sf.skip_newmv_in_drl >= 3 &&
          mode_info[ref_mv_idx].full_mv_bestsme > thr &&
          mode_info[prev_ref_idx].drl_cost < mode_info[ref_mv_idx].drl_cost) {
        best_mv->as_int = INVALID_MV;
        return;
      }
    }
  }

  if (cpi->common.features.cur_frame_force_integer_mv) {
    convert_fullmv_to_mv(best_mv);
  }

  const int use_fractional_mv =
      bestsme < INT_MAX && cpi->common.features.cur_frame_force_integer_mv == 0;
  int best_mv_rate = 0;
  int mv_rate_calculated = 0;
  if (use_fractional_mv) {
    int_mv fractional_ms_list[3];
    av1_set_fractional_mv(fractional_ms_list);
    int dis; /* TODO: use dis in distortion calculation later. */

    SUBPEL_MOTION_SEARCH_PARAMS ms_params;
    av1_make_default_subpel_ms_params(&ms_params, cpi, x, bsize, &ref_mv,
                                      cost_list);
    MV subpel_start_mv = get_mv_from_fullmv(&best_mv->as_fullmv);
    assert(av1_is_subpelmv_in_range(&ms_params.mv_limits, subpel_start_mv));

    switch (mbmi->motion_mode) {
      case SIMPLE_TRANSLATION:
        if (mv_sf->use_accurate_subpel_search) {
          const int try_second = second_best_mv.as_int != INVALID_MV &&
                                 second_best_mv.as_int != best_mv->as_int &&
                                 (mv_sf->disable_second_mv <= 1);
          const int best_mv_var = mv_search_params->find_fractional_mv_step(
              xd, cm, &ms_params, subpel_start_mv, &best_mv_stats,
              &best_mv->as_mv, &dis, &x->pred_sse[ref], fractional_ms_list);

          if (try_second) {
            struct macroblockd_plane *p = xd->plane;
            const BUFFER_SET orig_dst = {
              { p[0].dst.buf, p[1].dst.buf, p[2].dst.buf },
              { p[0].dst.stride, p[1].dst.stride, p[2].dst.stride },
            };
            int64_t rd = INT64_MAX;
            if (!mv_sf->disable_second_mv) {
              // Calculate actual rd cost.
              mbmi->mv[0].as_mv = best_mv->as_mv;
              av1_enc_build_inter_predictor(cm, xd, mi_row, mi_col, &orig_dst,
                                            bsize, 0, 0);
              av1_subtract_plane(x, bsize, 0);
              RD_STATS this_rd_stats;
              av1_init_rd_stats(&this_rd_stats);
              av1_estimate_txfm_yrd(cpi, x, &this_rd_stats, INT64_MAX, bsize,
                                    max_txsize_rect_lookup[bsize]);
              int this_mv_rate = av1_mv_bit_cost(
                  &best_mv->as_mv, &ref_mv, mv_costs->nmv_joint_cost,
                  mv_costs->mv_cost_stack, MV_COST_WEIGHT);
              rd = RDCOST(x->rdmult, this_mv_rate + this_rd_stats.rate,
                          this_rd_stats.dist);
            }

            MV this_best_mv;
            subpel_start_mv = get_mv_from_fullmv(&second_best_mv.as_fullmv);
            if (av1_is_subpelmv_in_range(&ms_params.mv_limits,
                                         subpel_start_mv)) {
              unsigned int sse;
              const int this_var = mv_search_params->find_fractional_mv_step(
                  xd, cm, &ms_params, subpel_start_mv, NULL, &this_best_mv,
                  &dis, &sse, fractional_ms_list);

              if (!mv_sf->disable_second_mv) {
                // If cpi->sf.mv_sf.disable_second_mv is 0, use actual rd cost
                // to choose the better MV.
                mbmi->mv[0].as_mv = this_best_mv;
                av1_enc_build_inter_predictor(cm, xd, mi_row, mi_col, &orig_dst,
                                              bsize, 0, 0);
                av1_subtract_plane(x, bsize, 0);
                RD_STATS tmp_rd_stats;
                av1_init_rd_stats(&tmp_rd_stats);
                av1_estimate_txfm_yrd(cpi, x, &tmp_rd_stats, INT64_MAX, bsize,
                                      max_txsize_rect_lookup[bsize]);
                int tmp_mv_rate = av1_mv_bit_cost(
                    &this_best_mv, &ref_mv, mv_costs->nmv_joint_cost,
                    mv_costs->mv_cost_stack, MV_COST_WEIGHT);
                int64_t tmp_rd =
                    RDCOST(x->rdmult, tmp_rd_stats.rate + tmp_mv_rate,
                           tmp_rd_stats.dist);
                if (tmp_rd < rd) {
                  best_mv->as_mv = this_best_mv;
                  x->pred_sse[ref] = sse;
                }
              } else {
                // If cpi->sf.mv_sf.disable_second_mv = 1, use var to decide the
                // best MV.
                if (this_var < best_mv_var) {
                  best_mv->as_mv = this_best_mv;
                  x->pred_sse[ref] = sse;
                }
              }
            }
          }
        } else {
          mv_search_params->find_fractional_mv_step(
              xd, cm, &ms_params, subpel_start_mv, &best_mv_stats,
              &best_mv->as_mv, &dis, &x->pred_sse[ref], NULL);
        }
        break;
      case OBMC_CAUSAL:
        av1_find_best_obmc_sub_pixel_tree_up(
            xd, cm, &ms_params, subpel_start_mv, NULL, &best_mv->as_mv, &dis,
            &x->pred_sse[ref], NULL);
        break;
      default: assert(0 && "Invalid motion mode!\n");
    }

    // Terminate search with the current ref_idx based on subpel mv and rate
    // cost.
    if (cpi->sf.inter_sf.skip_newmv_in_drl >= 1 && args != NULL &&
        mbmi->motion_mode == SIMPLE_TRANSLATION &&
        best_mv->as_int != INVALID_MV) {
      const int ref_mv_idx = mbmi->ref_mv_idx;
      best_mv_rate =
          av1_mv_bit_cost(&best_mv->as_mv, &ref_mv, mv_costs->nmv_joint_cost,
                          mv_costs->mv_cost_stack, MV_COST_WEIGHT);
      mv_rate_calculated = 1;

      for (int prev_ref_idx = 0; prev_ref_idx < ref_mv_idx; ++prev_ref_idx) {
        if (!args->single_newmv_valid[prev_ref_idx][ref]) continue;
        // Check if the motion vectors are the same.
        if (best_mv->as_int == args->single_newmv[prev_ref_idx][ref].as_int) {
          // Skip this evaluation if the previous one is skipped.
          if (mode_info[prev_ref_idx].skip) {
            mode_info[ref_mv_idx].skip = 1;
            break;
          }
          // Compare the rate cost that we current know.
          const int prev_rate_cost =
              args->single_newmv_rate[prev_ref_idx][ref] +
              mode_info[prev_ref_idx].drl_cost;
          const int this_rate_cost =
              best_mv_rate + mode_info[ref_mv_idx].drl_cost;

          if (prev_rate_cost <= this_rate_cost) {
            // If the current rate_cost is worse than the previous rate_cost,
            // then we terminate the search for this ref_mv_idx.
            mode_info[ref_mv_idx].skip = 1;
            break;
          }
        }
      }
    }
  }

  if (mv_rate_calculated) {
    *rate_mv = best_mv_rate;
  } else {
    *rate_mv =
        av1_mv_bit_cost(&best_mv->as_mv, &ref_mv, mv_costs->nmv_joint_cost,
                        mv_costs->mv_cost_stack, MV_COST_WEIGHT);
  }
}